

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

Gia_Man_t * Gia_ManCorrReduce(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  Gia_ManSetPhase(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_20->Value = uVar2;
    local_24 = local_24 + 1;
  }
  Gia_ManHashAlloc(p_00);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pGVar4 = Gia_ObjFanin0(pGStack_20);
    Gia_ManCorrReduce_rec(p_00,p,pGVar4);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_20);
    Gia_ManAppendCo(p_00,iVar1);
    local_24 = local_24 + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManCorrReduce( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}